

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_anewarray(ExecutionEngine *this)

{
  cp_info *constantPool;
  int iVar1;
  VMStack *this_00;
  Frame *this_01;
  cp_info **ppcVar2;
  u1 *puVar3;
  char *pcVar4;
  MethodArea *this_02;
  anon_union_8_10_52016fac_for_data this_03;
  ostream *poVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  Value VVar10;
  string className;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar10 = Frame::popTopOfOperandStack(this_01);
  if (VVar10.type != INT) {
    __assert_fail("count.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x112e,"void ExecutionEngine::i_anewarray()");
  }
  iVar9 = VVar10.data._0_4_;
  if (iVar9 < 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"NegativeArraySizeException");
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(1);
  }
  ppcVar2 = Frame::getConstantPool(this_01);
  constantPool = *ppcVar2;
  puVar3 = Frame::getCode(this_01,this_01->pc);
  uVar7 = (ulong)(ushort)(*(ushort *)(puVar3 + 1) << 8 | *(ushort *)(puVar3 + 1) >> 8);
  if (constantPool[uVar7 - 1].tag != '\a') {
    __assert_fail("classCP.tag == CONSTANT_Class",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x113b,"void ExecutionEngine::i_anewarray()");
  }
  pcVar4 = getFormattedConstant(constantPool,constantPool[uVar7 - 1].info.fieldref_info.class_index)
  ;
  std::__cxx11::string::string((string *)local_48,pcVar4,(allocator *)&local_68);
  iVar1 = std::__cxx11::string::compare((char *)local_48);
  if (iVar1 != 0) {
    for (lVar8 = 2; local_48[0][lVar8 + -2] == '['; lVar8 = lVar8 + 1) {
    }
    if (local_48[0][lVar8 + -2] == 'L') {
      this_02 = MethodArea::getInstance();
      std::__cxx11::string::substr((ulong)&local_68,(ulong)local_48);
      MethodArea::loadClassNamed(this_02,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
  }
  this_03.object = (Object *)operator_new(0x28);
  ArrayObject::ArrayObject((ArrayObject *)this_03.object,REFERENCE);
  if (iVar9 != 0) {
    uVar7 = 1;
    if (1 < iVar9) {
      uVar7 = VVar10.data.longValue & 0xffffffff;
    }
    do {
      ArrayObject::pushValue((ArrayObject *)this_03.object,(Value)ZEXT816(0x900000000));
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 0);
  }
  VVar10.data.object = (Object *)this_03.longValue;
  VVar10.printType = BOOLEAN;
  VVar10.type = REFERENCE;
  Frame::pushIntoOperandStack(this_01,VVar10);
  this_01->pc = this_01->pc + 3;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void ExecutionEngine::i_anewarray() {
    VMStack &stackFrame = VMStack::getInstance();       
    Frame *topFrame = stackFrame.getTopFrame();
    
    Value count = topFrame->popTopOfOperandStack(); // Número de elementos no array
    assert(count.type == ValueType::INT);
    if (count.data.intValue < 0) {
        cerr << "NegativeArraySizeException" << endl;
        exit(1);
    }
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t classIndex = (byte1 << 8) | byte2; // Índice na pool de constantes
    cp_info classCP = constantPool[classIndex-1];
    assert(classCP.tag == CONSTANT_Class);
    
    CONSTANT_Class_info classInfo = classCP.info.class_info; // Formata nome da classe
    string className = getFormattedConstant(constantPool, classInfo.name_index);

    if (className != "java/lang/String") {
        int i = 0;
        while (className[i] == '[') i++;
        if (className[i] == 'L') {
            MethodArea &methodArea = MethodArea::getInstance();
            methodArea.loadClassNamed(className.substr(i+1, className.size()-i-2)); // carrega a classe de referência (se ainda não foi).
        }
    }

    // criando objeto da classe instanciada
    Value objectref;
    objectref.type = ValueType::REFERENCE;
    objectref.data.object = new ArrayObject(ValueType::REFERENCE);
    
    // populando array com NULL
    Value nullValue;
    nullValue.type = ValueType::REFERENCE;
    nullValue.data.object = NULL;
    for (int i = 0; i < count.data.intValue; i++) {
        ((ArrayObject *) objectref.data.object)->pushValue(nullValue);
    }

    topFrame->pushIntoOperandStack(objectref);
    
    topFrame->pc += 3;
}